

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-try-write-error.c
# Opt level: O1

void incoming_close_cb(uv_handle_t *handle)

{
  FILE *__stream;
  uint err;
  char *pcVar1;
  undefined8 uStack_40;
  uv_buf_t local_30;
  
  close_cb_called = close_cb_called + 1;
  local_30 = uv_buf_init("meow",4);
  do {
    err = uv_try_write((uv_stream_t *)&client,&local_30,1);
    __stream = _stderr;
  } while (0 < (int)err);
  pcVar1 = uv_strerror(err);
  fprintf(__stream,"uv_try_write error: %d %s\n",(ulong)err,pcVar1);
  if ((err + 0x68 < 2) || (err == 0xffffffe0)) {
    if (client.write_queue_size == 0) {
      return;
    }
    pcVar1 = "client.write_queue_size == 0";
    uStack_40 = 0x34;
  }
  else {
    pcVar1 = "r == UV_EPIPE || r == UV_ECONNABORTED || r == UV_ECONNRESET";
    uStack_40 = 0x33;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-try-write-error.c"
          ,uStack_40,pcVar1);
  abort();
}

Assistant:

static void incoming_close_cb(uv_handle_t* handle) {
  uv_buf_t buf;
  int r = 1;

  close_cb_called++;

  buf = uv_buf_init("meow", 4);
  while (r > 0)
    r = uv_try_write((uv_stream_t*) &client, &buf, 1);
  fprintf(stderr, "uv_try_write error: %d %s\n", r, uv_strerror(r));
  ASSERT(r == UV_EPIPE || r == UV_ECONNABORTED || r == UV_ECONNRESET);
  ASSERT(client.write_queue_size == 0);
}